

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPlotIO.cpp
# Opt level: O2

bool __thiscall NaDPlotFile::GoNextRecord(NaDPlotFile *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  
  if ((this->aVars).nItems == 0) {
    return false;
  }
  lVar1 = this->iCase;
  iVar3 = (*(this->super_NaDataFile)._vptr_NaDataFile[7])();
  bVar2 = lVar1 < CONCAT44(extraout_var,iVar3);
  if (bVar2) {
    this->iCase = this->iCase + 1;
  }
  return bVar2;
}

Assistant:

bool    NaDPlotFile::GoNextRecord ()
{
    if(0 == aVars.count())
        return false;
    if(iCase >= CountOfRecord())
        return false;

    ++iCase;
    return true;
}